

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReaderCache::pruneData(PtexReaderCache *this)

{
  PtexLruItem *pPVar1;
  bool bVar2;
  PtexLruList<Ptex::v2_2::PtexCachedReader,_&Ptex::v2_2::PtexCachedReader::_activeFilesItem> *in_RDI
  ;
  size_t memUsedChange;
  PtexCachedReader *reader;
  size_t memUsed;
  size_t memUsedChangeTotal;
  PtexCachedReader *in_stack_ffffffffffffffd8;
  PtexReaderCache *in_stack_ffffffffffffffe0;
  long local_10;
  
  local_10 = 0;
  pPVar1 = in_RDI[9]._end._prev;
  while ((in_RDI[1]._end._prev < (PtexLruItem *)((long)&pPVar1->_prev + local_10) &&
         (in_stack_ffffffffffffffe0 =
               (PtexReaderCache *)
               PtexLruList<Ptex::v2_2::PtexCachedReader,_&Ptex::v2_2::PtexCachedReader::_activeFilesItem>
               ::pop(in_RDI), in_stack_ffffffffffffffe0 != (PtexReaderCache *)0x0))) {
    bVar2 = PtexCachedReader::tryPrune(in_stack_ffffffffffffffd8,(size_t *)in_RDI);
    if (bVar2) {
      local_10 = (long)&(in_stack_ffffffffffffffd8->super_PtexReader).super_PtexTexture.
                        _vptr_PtexTexture + local_10;
    }
  }
  adjustMemUsed(in_stack_ffffffffffffffe0,(size_t)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void PtexReaderCache::pruneData()
{
    size_t memUsedChangeTotal = 0;
    size_t memUsed = _memUsed;
    while (memUsed + memUsedChangeTotal > _maxMem) {
        PtexCachedReader* reader = _activeFiles.pop();
        if (!reader) break;
        size_t memUsedChange;
        if (reader->tryPrune(memUsedChange)) {
            // Note: after clearing, memUsedChange is negative
            memUsedChangeTotal += memUsedChange;
        }
    }
    adjustMemUsed(memUsedChangeTotal);
}